

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O3

void __thiscall flow::lang::Symbol::Symbol(Symbol *this,Type t,string *name,SourceLocation *loc)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
  (this->super_ASTNode).location_.filename._M_dataplus._M_p =
       (pointer)&(this->super_ASTNode).location_.filename.field_2;
  pcVar1 = (loc->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ASTNode).location_,pcVar1,
             pcVar1 + (loc->filename)._M_string_length);
  uVar2 = (loc->end).offset;
  (this->super_ASTNode).location_.end.column = (loc->end).column;
  (this->super_ASTNode).location_.end.offset = uVar2;
  uVar2 = (loc->begin).column;
  uVar3 = (loc->begin).offset;
  uVar4 = (loc->end).line;
  (this->super_ASTNode).location_.begin.line = (loc->begin).line;
  (this->super_ASTNode).location_.begin.column = uVar2;
  (this->super_ASTNode).location_.begin.offset = uVar3;
  (this->super_ASTNode).location_.end.line = uVar4;
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__Symbol_001ae868;
  this->type_ = t;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->owner_ = (SymbolTable *)0x0;
  return;
}

Assistant:

Symbol(Type t, const std::string& name, const SourceLocation& loc)
      : ASTNode(loc), type_(t), name_(name), owner_(nullptr) {}